

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O0

uintptr_t websocket_subscribe(websocket_subscribe_s args)

{
  long lVar1;
  long lVar2;
  subscribe_args_s args_00;
  int iVar3;
  long *plVar4;
  int *piVar5;
  subscription_s *obj;
  long in_stack_00000008;
  long *plVar6;
  fio_ls_s *pos;
  subscription_s *sub;
  intptr_t br_type;
  _func_void_fio_msg_s_ptr *handler;
  websocket_sub_data_s *d;
  
  plVar6 = &stack0x00000008;
  if ((in_stack_00000008 == 0) ||
     (iVar3 = fio_is_valid(*(intptr_t *)(in_stack_00000008 + 0x30)), iVar3 == 0)) {
    if (plVar6[5] != 0) {
      (*(code *)plVar6[5])(plVar6[6]);
    }
    d = (websocket_sub_data_s *)0x0;
  }
  else {
    plVar4 = (long *)malloc(0x18);
    if (plVar4 == (long *)0x0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/http/websockets.c:635"
                      );
      }
      kill(0,2);
      piVar5 = __errno_location();
      exit(*piVar5);
    }
    lVar1 = plVar6[5];
    lVar2 = plVar6[6];
    *plVar4 = plVar6[4];
    plVar4[1] = lVar1;
    plVar4[2] = lVar2;
    br_type = (intptr_t)websocket_on_pubsub_message;
    if (plVar6[4] == 0) {
      if ((*(byte *)(plVar6 + 8) & 1) == 0) {
        if ((*(byte *)(plVar6 + 8) >> 1 & 1) == 0) {
          sub = (subscription_s *)0xffffffffffffffe0;
          br_type = (intptr_t)websocket_on_pubsub_message_direct;
        }
        else {
          sub = (subscription_s *)0xffffffffffffffdf;
          br_type = (intptr_t)websocket_on_pubsub_message_direct_txt;
        }
      }
      else {
        sub = (subscription_s *)0xffffffffffffffde;
        br_type = (intptr_t)websocket_on_pubsub_message_direct_bin;
      }
      websocket_optimize4broadcasts((intptr_t)sub,1);
      *plVar4 = (long)sub;
    }
    args_00.channel.data = (char *)plVar6[7];
    args_00._0_24_ = *(undefined1 (*) [24])(plVar6 + 1);
    args_00.match = (fio_match_fn)br_type;
    args_00.on_message = websocket_on_unsubscribe;
    args_00.on_unsubscribe = (_func_void_void_ptr_void_ptr *)*(undefined8 *)(*plVar6 + 0x30);
    args_00.udata1 = plVar4;
    args_00.udata2 = plVar6;
    obj = fio_subscribe(args_00);
    if (obj == (subscription_s *)0x0) {
      d = (websocket_sub_data_s *)0x0;
    }
    else {
      fio_lock((fio_lock_i *)(*plVar6 + 0x88));
      d = (websocket_sub_data_s *)fio_ls_push((fio_ls_s *)(*plVar6 + 0x70),obj);
      fio_unlock((fio_lock_i *)(*plVar6 + 0x88));
    }
  }
  return (uintptr_t)d;
}

Assistant:

uintptr_t websocket_subscribe(struct websocket_subscribe_s args) {
  if (!args.ws || !fio_is_valid(args.ws->fd))
    goto error;
  websocket_sub_data_s *d = malloc(sizeof(*d));
  FIO_ASSERT_ALLOC(d);
  *d = (websocket_sub_data_s){
      .udata = args.udata,
      .on_message = args.on_message,
      .on_unsubscribe = args.on_unsubscribe,
  };
  void (*handler)(fio_msg_s *) = websocket_on_pubsub_message;
  if (!args.on_message) {
    intptr_t br_type;
    if (args.force_binary) {
      br_type = WEBSOCKET_OPTIMIZE_PUBSUB_BINARY;
      handler = websocket_on_pubsub_message_direct_bin;
    } else if (args.force_text) {
      br_type = WEBSOCKET_OPTIMIZE_PUBSUB_TEXT;
      handler = websocket_on_pubsub_message_direct_txt;
    } else {
      br_type = WEBSOCKET_OPTIMIZE_PUBSUB;
      handler = websocket_on_pubsub_message_direct;
    }
    websocket_optimize4broadcasts(br_type, 1);
    d->on_message =
        (void (*)(ws_s *, fio_str_info_s, fio_str_info_s, void *))br_type;
  }
  subscription_s *sub =
      fio_subscribe(.channel = args.channel, .match = args.match,
                    .on_unsubscribe = websocket_on_unsubscribe,
                    .on_message = handler, .udata1 = (void *)args.ws->fd,
                    .udata2 = d);
  if (!sub) {
    /* don't free `d`, return (`d` freed by fio_subscribe) */
    return 0;
  }
  fio_ls_s *pos;
  fio_lock(&args.ws->sub_lock);
  pos = fio_ls_push(&args.ws->subscriptions, sub);
  fio_unlock(&args.ws->sub_lock);

  return (uintptr_t)pos;
error:
  if (args.on_unsubscribe)
    args.on_unsubscribe(args.udata);
  return 0;
}